

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

Float pbrt::BeamDiffusionMS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  Float FVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  float in_XMM1_Da;
  float in_XMM2_Da;
  Float in_XMM3_Da;
  uint in_XMM4_Da;
  Float kappa;
  Float E;
  Float EDn;
  Float phiD;
  Float dv;
  Float dr;
  Float zv;
  Float zr;
  int i;
  Float cE;
  Float cPhi;
  Float ze;
  Float fm2;
  Float fm1;
  Float sigma_tr;
  Float D_g;
  Float rhop;
  Float sigmap_t;
  Float sigmap_s;
  Float Ed;
  int nSamples;
  undefined4 local_48;
  undefined4 local_1c;
  
  local_1c = 0.0;
  fVar2 = in_XMM0_Da * (1.0 - in_XMM2_Da);
  fVar1 = in_XMM1_Da + fVar2;
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)in_XMM1_Da),
                           ZEXT416((uint)fVar2));
  fVar9 = auVar3._0_4_ / (fVar1 * 3.0 * fVar1);
  fVar10 = SafeSqrt(0.0);
  FVar11 = FresnelMoment1(in_XMM3_Da);
  FVar12 = FresnelMoment2(in_XMM3_Da);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)FVar12),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)FVar11),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)FVar11),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)FVar12),
                           SUB6416(ZEXT464(0x3f800000),0));
  for (local_48 = 0; local_48 < 100; local_48 = local_48 + 1) {
    dVar17 = std::log((double)(ulong)(uint)(1.0 - ((float)local_48 + 0.5) / 100.0));
    fVar13 = -SUB84(dVar17,0) / fVar1;
    auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                             ZEXT416((uint)((fVar9 * -2.0 * auVar3._0_4_) / auVar4._0_4_)),
                             ZEXT416((uint)-fVar13));
    fVar14 = auVar7._0_4_;
    auVar7 = vfmadd213ss_fma(ZEXT416(in_XMM4_Da),ZEXT416(in_XMM4_Da),
                             ZEXT416((uint)(fVar13 * fVar13)));
    dVar17 = std::sqrt(auVar7._0_8_);
    fVar15 = SUB84(dVar17,0);
    auVar7 = vfmadd213ss_fma(ZEXT416(in_XMM4_Da),ZEXT416(in_XMM4_Da),
                             ZEXT416((uint)(fVar14 * fVar14)));
    dVar17 = std::sqrt(auVar7._0_8_);
    fVar16 = SUB84(dVar17,0);
    dVar17 = std::exp((double)(ulong)(uint)(-fVar10 * fVar15));
    dVar18 = std::exp((double)(ulong)(uint)(-fVar10 * fVar16));
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar10),
                             SUB6416(ZEXT464(0x3f800000),0));
    dVar19 = std::exp((double)(ulong)(uint)(-fVar10 * fVar15));
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)fVar10),
                             SUB6416(ZEXT464(0x3f800000),0));
    dVar20 = std::exp((double)(ulong)(uint)(-fVar10 * fVar16));
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)(auVar5._0_4_ * 0.25)),
                             ZEXT416((uint)((0.07957747 / fVar9) *
                                           (SUB84(dVar17,0) / fVar15 - SUB84(dVar18,0) / fVar16))),
                             ZEXT416((uint)(((fVar13 * auVar7._0_4_ * SUB84(dVar19,0)) /
                                             (fVar15 * fVar15 * fVar15) -
                                            (fVar14 * auVar8._0_4_ * SUB84(dVar20,0)) /
                                            (fVar16 * fVar16 * fVar16)) * 0.07957747 *
                                           auVar6._0_4_ * 0.5)));
    dVar17 = std::exp((double)(ulong)(uint)(fVar1 * -2.0 * (fVar15 + fVar13)));
    auVar7 = vfmadd213ss_fma(ZEXT416(auVar7._0_4_),
                             ZEXT416((uint)((1.0 - SUB84(dVar17,0)) * (fVar2 / fVar1) *
                                           (fVar2 / fVar1))),ZEXT416((uint)local_1c));
    local_1c = auVar7._0_4_;
  }
  return local_1c / 100.0;
}

Assistant:

Float BeamDiffusionMS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    const int nSamples = 100;
    Float Ed = 0;
    // Precompute information for dipole integrand
    // Compute reduced scattering coefficients $\sigmaps, \sigmapt$ and albedo $\rhop$
    Float sigmap_s = sigma_s * (1 - g);
    Float sigmap_t = sigma_a + sigmap_s;
    Float rhop = sigmap_s / sigmap_t;

    // Compute non-classical diffusion coefficient $D_\roman{G}$ using Equation
    // $(\ref{eq:diffusion-coefficient-grosjean})$
    Float D_g = (2 * sigma_a + sigmap_s) / (3 * sigmap_t * sigmap_t);

    // Compute effective transport coefficient $\sigmatr$ based on $D_\roman{G}$
    Float sigma_tr = SafeSqrt(sigma_a / D_g);

    // Determine linear extrapolation distance $\depthextrapolation$ using Equation
    // $(\ref{eq:dipole-boundary-condition})$
    Float fm1 = FresnelMoment1(eta), fm2 = FresnelMoment2(eta);
    Float ze = -2 * D_g * (1 + 3 * fm2) / (1 - 2 * fm1);

    // Determine exitance scale factors using Equations $(\ref{eq:kp-exitance-phi})$ and
    // $(\ref{eq:kp-exitance-e})$
    Float cPhi = .25f * (1 - 2 * fm1), cE = .5f * (1 - 3 * fm2);

    for (int i = 0; i < nSamples; ++i) {
        // Sample real point source depth $\depthreal$
        Float zr = -std::log(1 - (i + .5f) / nSamples) / sigmap_t;

        // Evaluate dipole integrand $E_{\roman{d}}$ at $\depthreal$ and add to _Ed_
        Float zv = -zr + 2 * ze;
        Float dr = std::sqrt(r * r + zr * zr), dv = std::sqrt(r * r + zv * zv);
        // Compute dipole fluence rate $\dipole(r)$ using Equation
        // $(\ref{eq:diffusion-dipole})$
        Float phiD = Inv4Pi / D_g *
                     (std::exp(-sigma_tr * dr) / dr - std::exp(-sigma_tr * dv) / dv);

        // Compute dipole vector irradiance $-\N{}\cdot\dipoleE(r)$ using Equation
        // $(\ref{eq:diffusion-dipole-vector-irradiance-normal})$
        Float EDn =
            Inv4Pi *
            (zr * (1 + sigma_tr * dr) * std::exp(-sigma_tr * dr) / (dr * dr * dr) -
             zv * (1 + sigma_tr * dv) * std::exp(-sigma_tr * dv) / (dv * dv * dv));

        // Add contribution from dipole for depth $\depthreal$ to _Ed_
        Float E = phiD * cPhi + EDn * cE;
        Float kappa = 1 - std::exp(-2 * sigmap_t * (dr + zr));
        Ed += kappa * rhop * rhop * E;
    }
    return Ed / nSamples;
}